

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

int __thiscall
ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *determinant,double *pivot)

{
  double **ppdVar1;
  ulong uVar2;
  double ***pppdVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_90;
  double local_68;
  
  uVar6 = this->m_row_count;
  uVar2 = (ulong)uVar6;
  pppdVar3 = &this->m;
  if (uVar6 == (this->m_rowmem).m_count) {
    pppdVar3 = &(this->m_rowmem).m_a;
  }
  uVar9 = this->m_col_count;
  if ((int)uVar6 < this->m_col_count) {
    uVar9 = uVar6;
  }
  if ((int)uVar9 < 1) {
    local_68 = 1.0;
    iVar10 = 0;
    dVar14 = 1.0;
  }
  else {
    ppdVar1 = *pppdVar3;
    local_68 = 1.0;
    uVar11 = 1;
    local_90 = 1.0;
    uVar7 = 0;
    do {
      pdVar4 = ppdVar1[uVar7];
      dVar15 = pdVar4[uVar7];
      dVar13 = ABS(dVar15);
      uVar8 = uVar7 + 1;
      if ((long)uVar8 < (long)(int)uVar2) {
        uVar12 = uVar7 & 0xffffffff;
        uVar5 = uVar11;
        do {
          if (dVar13 < ABS(ppdVar1[uVar5][uVar7])) {
            uVar12 = uVar5 & 0xffffffff;
            dVar13 = ABS(ppdVar1[uVar5][uVar7]);
          }
          uVar5 = uVar5 + 1;
        } while ((uVar2 & 0xffffffff) != uVar5);
      }
      else {
        uVar12 = uVar7 & 0xffffffff;
      }
      dVar14 = dVar13;
      if ((uVar7 != 0) && (local_90 <= dVar13)) {
        dVar14 = local_90;
      }
      if (dVar13 <= zero_tolerance) {
        local_68 = 0.0;
        goto LAB_004f2057;
      }
      if (uVar7 != uVar12) {
        SwapRows(this,(int)uVar12,(uint)uVar7);
        local_68 = -local_68;
        pdVar4 = ppdVar1[uVar7];
        dVar15 = pdVar4[uVar7];
      }
      pdVar4[uVar7] = 1.0;
      uVar6 = ~(uint)uVar7;
      ON_ArrayScale(this->m_col_count + uVar6,1.0 / dVar15,pdVar4 + uVar8,pdVar4 + uVar8);
      uVar2 = (ulong)this->m_row_count;
      uVar12 = uVar11;
      if ((long)uVar8 < (long)uVar2) {
        do {
          pdVar4 = ppdVar1[uVar12];
          dVar13 = pdVar4[uVar7];
          pdVar4[uVar7] = 0.0;
          if (zero_tolerance < ABS(dVar13)) {
            ON_Array_aA_plus_B(this->m_col_count + uVar6,-dVar13,ppdVar1[uVar7] + uVar8,
                               pdVar4 + uVar8,pdVar4 + uVar8);
            uVar2 = (ulong)(uint)this->m_row_count;
          }
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < (int)uVar2);
      }
      local_68 = local_68 * dVar15;
      uVar11 = uVar11 + 1;
      uVar7 = uVar8;
      local_90 = dVar14;
    } while (uVar8 != uVar9);
    uVar7 = (ulong)uVar9;
LAB_004f2057:
    iVar10 = (int)uVar7;
  }
  *pivot = dVar14;
  *determinant = local_68;
  return iVar10;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double& determinant,
    double& pivot 
    )
{
  double x, piv, det;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = det = 1.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance ) {
      det = 0.0;
      break;
    }
    rank++;

    if ( ix != k )
    {
      // swap rows
      SwapRows( ix, k );
      det = -det;
    }

    // scale row k of matrix and B
    det *= this_m[k][k];
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
      }
    }
  }

  pivot = piv;
  determinant = det;

  return rank;
}